

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42drivr.c
# Opt level: O1

FT_UInt t42_get_name_index(T42_Face face,FT_String *glyph_name)

{
  char *__s2;
  bool bVar1;
  int iVar2;
  long lVar3;
  long unaff_R15;
  
  if (0 < (face->type1).num_glyphs) {
    lVar3 = 0;
    do {
      __s2 = (face->type1).glyph_names[lVar3];
      bVar1 = true;
      if ((*glyph_name == *__s2) && (iVar2 = strcmp(glyph_name,__s2), iVar2 == 0)) {
        bVar1 = false;
        unaff_R15 = strtol((char *)(face->type1).charstrings[lVar3],(char **)0x0,10);
      }
      if (!bVar1) {
        return (FT_UInt)unaff_R15;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (face->type1).num_glyphs);
  }
  return 0;
}

Assistant:

static FT_UInt
  t42_get_name_index( T42_Face    face,
                      FT_String*  glyph_name )
  {
    FT_Int  i;


    for ( i = 0; i < face->type1.num_glyphs; i++ )
    {
      FT_String*  gname = face->type1.glyph_names[i];


      if ( glyph_name[0] == gname[0] && !ft_strcmp( glyph_name, gname ) )
        return (FT_UInt)ft_strtol( (const char *)face->type1.charstrings[i],
                                   NULL, 10 );
    }

    return 0;
  }